

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O2

int4 __thiscall
ConstructTpl::fillinBuild
          (ConstructTpl *this,vector<int,_std::allocator<int>_> *check,AddrSpace *const_space)

{
  int iVar1;
  pointer ppOVar2;
  VarnodeTpl *this_00;
  pointer piVar3;
  pointer ppOVar4;
  ulong val;
  OpTpl *local_a0;
  AddrSpace *local_98;
  ConstTpl local_90;
  ConstTpl local_70;
  ConstTpl local_50;
  
  ppOVar4 = (this->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar2 = (this->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  piVar3 = (check->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  do {
    if (ppOVar4 == ppOVar2) {
      local_98 = const_space;
      for (val = 0; val < (ulong)((long)(check->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >>
                                 2); val = val + 1) {
        if (piVar3[val] == 0) {
          local_a0 = (OpTpl *)operator_new(0x28);
          (local_a0->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (local_a0->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_a0->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a0->opc = CPUI_MULTIEQUAL;
          local_a0->output = (VarnodeTpl *)0x0;
          this_00 = (VarnodeTpl *)operator_new(0x68);
          ConstTpl::ConstTpl(&local_70,local_98);
          ConstTpl::ConstTpl(&local_90,real,val);
          ConstTpl::ConstTpl(&local_50,real,4);
          VarnodeTpl::VarnodeTpl(this_00,&local_70,&local_90,&local_50);
          OpTpl::addInput(local_a0,this_00);
          std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::insert
                    (&this->vec,
                     (const_iterator)
                     (this->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_a0);
          piVar3 = (check->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
      }
      return 0;
    }
    if ((*ppOVar4)->opc == CPUI_MULTIEQUAL) {
      iVar1 = (int)((*((*ppOVar4)->input).
                      super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->offset).value_real;
      if (piVar3[iVar1] != 0) {
        return piVar3[iVar1];
      }
      piVar3[iVar1] = 1;
    }
    ppOVar4 = ppOVar4 + 1;
  } while( true );
}

Assistant:

int4 ConstructTpl::fillinBuild(vector<int4> &check,AddrSpace *const_space)

{ // Make sure there is a build statement for all subtable params
  // Return 0 upon success, 1 if there is a duplicate BUILD, 2 if there is a build for a non-subtable
  vector<OpTpl *>::iterator iter;
  OpTpl *op;
  VarnodeTpl *indvn;

  for(iter=vec.begin();iter!=vec.end();++iter) {
    op = *iter;
    if (op->getOpcode() == BUILD) {
      int4 index = op->getIn(0)->getOffset().getReal();
      if (check[index] != 0)
	return check[index];	// Duplicate BUILD statement or non-subtable
      check[index] = 1;		// Mark to avoid future duplicate build
    }
  }
  for(int4 i=0;i<check.size();++i) {
    if (check[i] == 0) {	// Didn't see a BUILD statement
      op = new OpTpl(BUILD);
      indvn = new VarnodeTpl(ConstTpl(const_space),
			      ConstTpl(ConstTpl::real,i),
			      ConstTpl(ConstTpl::real,4));
      op->addInput(indvn);
      vec.insert(vec.begin(),op);
    }
  }
  return 0;
}